

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O2

TestStatus *
vkt::FragmentOperations::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,int numViewports)

{
  VkBool32 *this;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  TestLog *log;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  VkImageSubresourceRange subresourceRange;
  Allocation *pAVar2;
  Handle<(vk::HandleType)8> HVar3;
  Handle<(vk::HandleType)14> HVar4;
  Handle<(vk::HandleType)14> HVar5;
  Handle<(vk::HandleType)14> HVar6;
  Handle<(vk::HandleType)14> HVar7;
  Handle<(vk::HandleType)14> HVar8;
  float fVar9;
  int iVar10;
  deUint32 queueFamilyIndex;
  VkResult result;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vk_00;
  VkDevice device;
  Allocator *pAVar11;
  TextureFormat format;
  DeviceInterface *pDVar12;
  VkDevice pVVar13;
  ProgramBinary *pPVar14;
  VkQueue queue;
  NotSupportedError *this_00;
  ChannelOrder CVar15;
  VkDeviceSize bufferSize;
  size_t i;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ChannelType CVar19;
  pointer pVVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined4 in_stack_fffffffffffff6f8;
  undefined4 uVar25;
  undefined4 in_stack_fffffffffffff6fc;
  undefined4 in_stack_fffffffffffff700;
  undefined4 uVar26;
  undefined4 in_stack_fffffffffffff704;
  undefined4 uVar27;
  IVec2 renderSize;
  ConstPixelBufferAccess resultImage;
  TextureLevel referenceImage;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> scissors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexColors;
  VkPhysicalDeviceFeatures features;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  Vector<int,_2> local_580;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_578;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> rectScissors;
  _Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> local_540;
  undefined8 local_528;
  undefined8 uStack_520;
  deUint32 local_518;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_508;
  Vector<float,_4> local_4e8;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> viewports;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  TextureFormat local_468;
  int aiStack_460 [2];
  deUint32 *local_458;
  VkDeviceSize VStack_450;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_448;
  undefined1 local_428 [16];
  RefBase<vk::Handle<(vk::HandleType)13>_> local_418;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_3f8;
  undefined1 local_3d8 [16];
  RefBase<vk::Handle<(vk::HandleType)14>_> local_3c8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_3a8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_388;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_368;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_348;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_328;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_308;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_2e8;
  RefBase<vk::VkCommandBuffer_s_*> local_2c8 [3];
  uint local_24c;
  VkAttachmentReference colorAttachmentRef;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [1];
  VkViewport res_1;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceFeatures(&features,vk,physicalDevice);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_488,vk,physicalDevice);
  if (features.geometryShader == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Required feature is not supported: geometryShader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x179);
  }
  else if (features.multiViewport == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Required feature is not supported: multiViewport",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x17c);
  }
  else {
    if (0xf < local_24c) {
      vk_00 = Context::getDeviceInterface(context);
      device = Context::getDevice(context);
      pAVar11 = Context::getDefaultAllocator(context);
      renderSize.m_data[0] = 0x80;
      renderSize.m_data[1] = 0x80;
      local_4e8.m_data[0] = 0.5;
      local_4e8.m_data[1] = 0.5;
      local_4e8.m_data[2] = 0.5;
      local_4e8.m_data[3] = 1.0;
      local_488._0_4_ = 0x3e3851ec;
      local_488._4_4_ = 0x3ed70a3d;
      fStack_480 = 0.17;
      fStack_47c = 1.0;
      local_478._M_allocated_capacity._0_4_ = 0x3e947ae1;
      local_478._M_allocated_capacity._4_4_ = 0x3f1eb852;
      local_478._8_4_ = 0x3e8f5c29;
      local_478._12_4_ = 0x3f800000;
      local_468.order = 0x3f170a3d;
      local_468.type = 0x3f570a3d;
      aiStack_460[0] = 0x3ee147ae;
      aiStack_460[1] = 0x3f800000;
      local_458 = (deUint32 *)0x3f7333333f75c28f;
      VStack_450._0_4_ = 0.72;
      VStack_450._4_4_ = 1.0;
      local_448.m_data.object.m_internal = 0x3f0ccccd3f70a3d7;
      local_448.m_data.deleter.m_deviceIface = (DeviceInterface *)0x3f8000003ec7ae14;
      local_448.m_data.deleter.m_device = (VkDevice)0x3e428f5c3f51eb85;
      local_448.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x3f8000003df5c28f;
      local_428._0_8_ = (Allocation *)0x3e19999a3eeb851f;
      local_428._8_8_ = 0x3f8000003e851eb8;
      local_418.m_data.object.m_internal = 0x3e0f5c293e75c28f;
      local_418.m_data.deleter.m_deviceIface = (DeviceInterface *)0x3f8000003e75c28f;
      local_418.m_data.deleter.m_device = (VkDevice)0x3e9eb8523efae148;
      local_418.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x3f8000003e851eb8;
      local_3f8.m_data.object.m_internal = 0x3f051eb83f47ae14;
      local_3f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x3f8000003ea8f5c3;
      local_3f8.m_data.deleter.m_device = (VkDevice)0x3f51eb853f70a3d7;
      local_3f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x3f8000003e9eb852;
      local_3d8._0_8_ = (VkAllocationCallbacks *)0x3f2666663f7ae148;
      local_3d8._8_8_ = 0x3f8000003e99999a;
      local_3c8.m_data.object.m_internal = 0x3f2666663e6147ae;
      local_3c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x3f8000003f07ae14;
      local_3c8.m_data.deleter.m_device = (VkDevice)0x3f4f5c293f2b851f;
      local_3c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x3f8000003f68f5c3;
      local_3a8.m_data.object.m_internal = 0x3ee147ae3edc28f6;
      local_3a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x3f8000003f400000;
      local_3a8.m_data.deleter.m_device = (VkDevice)0x3e75c28f3e851eb8;
      local_3a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x3f8000003ef5c28f;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      vector<tcu::Vector<float,4>const*,void>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertexColors,
                 (Vector<float,_4> *)local_488,
                 (Vector<float,_4> *)(local_488 + (long)numViewports * 0x10),
                 (allocator_type *)&features);
      fVar22 = (float)numViewports;
      if (fVar22 < 0.0) {
        fVar23 = sqrtf(fVar22);
      }
      else {
        fVar23 = SQRT(fVar22);
      }
      fVar24 = ceilf(fVar23);
      fVar23 = ceilf(fVar22 / (float)(int)fVar24);
      fVar22 = (float)(renderSize.m_data[0] / (int)fVar24);
      fVar23 = (float)(renderSize.m_data[1] / (int)fVar23);
      scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      scissors.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::reserve
                (&scissors,(long)numViewports);
      CVar15 = R;
      iVar10 = 0;
      if (0 < numViewports) {
        iVar10 = numViewports;
      }
      CVar19 = SNORM_INT8;
      for (iVar17 = 0; iVar10 != iVar17; iVar17 = iVar17 + 1) {
        if (iVar17 != 0) {
          bVar21 = iVar17 % (int)fVar24 == 0;
          if (bVar21) {
            CVar15 = R;
          }
          fVar9 = 0.0;
          if (bVar21) {
            fVar9 = fVar23;
          }
          CVar19 = CVar19 + (int)fVar9;
        }
        local_488._4_4_ = CVar19;
        local_488._0_4_ = CVar15;
        fStack_480 = fVar22;
        fStack_47c = fVar23;
        std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
        emplace_back<tcu::Vector<int,4>>
                  ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)&scissors,
                   (Vector<int,_4> *)local_488);
        CVar15 = CVar15 + (int)fVar22;
      }
      iVar17 = renderSize.m_data[1] * renderSize.m_data[0];
      format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
      iVar10 = tcu::getPixelSize(format);
      bufferSize = (VkDeviceSize)(iVar17 * iVar10);
      makeBufferCreateInfo((VkBufferCreateInfo *)local_488,bufferSize,2);
      makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&features,vk_00,device,
                 (VkBufferCreateInfo *)local_488);
      local_508.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_508.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_508.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_508.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0;
      features.tessellationShader = 0;
      features.sampleRateShading = 0;
      features.dualSrcBlend = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&features);
      bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_488,vk_00,
                 device,pAVar11,(VkBuffer)local_508.m_data.object.m_internal,(MemoryRequirement)0x1)
      ;
      colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
      ptr = (Allocation *)local_488;
      local_488._0_4_ = R;
      local_488._4_4_ = SNORM_INT8;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_488);
      pAVar2 = colorBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      memset((colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.ptr)->m_hostPtr,0,bufferSize);
      ::vk::flushMappedMemoryRange
                (vk_00,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
                 bufferSize);
      features._0_8_ = context->m_testCtx->m_log;
      this = &features.imageCubeArray;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::operator<<((ostream *)this,"Rendering a colorful grid of ");
      std::ostream::operator<<(this,numViewports);
      std::operator<<((ostream *)this," rectangle(s).");
      local_488 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&features,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_480);
      std::operator<<((ostream *)&fStack_480,"Not covered area will be filled with a gray color.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_488,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_480);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)local_488,&renderSize);
      fStack_480 = 5.1848e-44;
      fStack_47c = 1.4013e-45;
      local_478._M_allocated_capacity._0_4_ = VK_PHYSICAL_DEVICE_TYPE_OTHER;
      local_478._M_allocated_capacity._4_4_ = 1;
      local_478._8_4_ = 0;
      local_478._12_4_ = 1;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_468,&local_4e8);
      local_458 = (deUint32 *)CONCAT44(local_458._4_4_,numViewports);
      VStack_450 = (long)vertexColors.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vertexColors.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      local_448.m_data.object.m_internal = 0;
      local_448.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_428._0_8_ = (Allocation *)0x0;
      local_448.m_data.deleter.m_device = (VkDevice)0x0;
      local_448.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      local_418.m_data.object.m_internal = 0;
      local_418.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_418.m_data.deleter.m_device = (VkDevice)0x0;
      local_418.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      local_3f8.m_data.object.m_internal = 0;
      local_3f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_3f8.m_data.deleter.m_device = (VkDevice)0x0;
      local_3f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      local_3d8._0_8_ = (VkAllocationCallbacks *)0x0;
      memset(&local_3c8,0,0x120);
      pDVar12 = Context::getDeviceInterface(context);
      pVVar13 = Context::getDevice(context);
      queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
      pAVar11 = Context::getDefaultAllocator(context);
      features.robustBufferAccess = 0xe;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0;
      features.tessellationShader = 1;
      features.sampleRateShading = (VkBool32)fStack_480;
      features.dualSrcBlend = local_488._0_4_;
      features.logicOp = local_488._4_4_;
      features.multiDrawIndirect = 1;
      features.drawIndirectFirstInstance = 1;
      features.depthClamp = 1;
      features.depthBiasClamp = 1;
      features.fillModeNonSolid = 0;
      features.depthBounds = 0x11;
      features.wideLines = 0;
      features.largePoints = 0;
      features.multiViewport = 0;
      features.samplerAnisotropy = 0;
      features._80_8_ = (ulong)features.textureCompressionASTC_LDR << 0x20;
      makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&referenceImage,pDVar12,pVVar13,
                (VkImageCreateInfo *)&features);
      resultImage.m_size.m_data[2] = referenceImage.m_size.m_data[2];
      resultImage.m_pitch.m_data[0] = referenceImage._20_4_;
      resultImage.m_pitch.m_data._4_8_ = referenceImage.m_data.m_ptr;
      resultImage.m_format = referenceImage.m_format;
      resultImage.m_size.m_data[0] = referenceImage.m_size.m_data[0];
      resultImage.m_size.m_data[1] = referenceImage.m_size.m_data[1];
      referenceImage.m_format.order = R;
      referenceImage.m_format.type = SNORM_INT8;
      referenceImage.m_size.m_data[0] = 0;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage.m_size.m_data[2] = 0;
      referenceImage._20_4_ = 0;
      referenceImage.m_data.m_ptr = (void *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset(&local_448);
      local_448.m_data.deleter.m_device = (VkDevice)resultImage._16_8_;
      local_448.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
      local_448.m_data.object.m_internal._0_4_ = resultImage.m_format.order;
      local_448.m_data.object.m_internal._4_4_ = resultImage.m_format.type;
      local_448.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&referenceImage);
      bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&features,pDVar12,
                pVVar13,pAVar11,(VkImage)local_448.m_data.object.m_internal,(MemoryRequirement)0x0);
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      data.ptr._4_4_ = in_stack_fffffffffffff6fc;
      data.ptr._0_4_ = in_stack_fffffffffffff6f8;
      data._8_4_ = in_stack_fffffffffffff700;
      data._12_4_ = in_stack_fffffffffffff704;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_428,data);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&features);
      local_528 = CONCAT44(local_478._M_allocated_capacity._0_4_,fStack_47c);
      uStack_520 = CONCAT44(local_478._8_4_,local_478._M_allocated_capacity._4_4_);
      local_518 = local_478._12_4_;
      subresourceRange.baseMipLevel = local_478._M_allocated_capacity._0_4_;
      subresourceRange.aspectMask = (VkImageAspectFlags)fStack_47c;
      subresourceRange.levelCount = local_478._M_allocated_capacity._4_4_;
      subresourceRange.baseArrayLayer = local_478._8_4_;
      subresourceRange.layerCount = local_478._12_4_;
      fVar22 = fStack_47c;
      uVar25 = local_478._M_allocated_capacity._0_4_;
      uVar26 = local_478._M_allocated_capacity._4_4_;
      uVar27 = local_478._8_4_;
      makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&resultImage,pDVar12,pVVar13,
                    (VkImage)local_448.m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,
                    (VkFormat)fStack_480,subresourceRange);
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset(&local_418);
      local_418.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_418.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_418.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_418.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_418.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&resultImage);
      makeBufferCreateInfo((VkBufferCreateInfo *)&features,VStack_450,0x80);
      makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&referenceImage,pDVar12,pVVar13,
                 (VkBufferCreateInfo *)&features);
      resultImage.m_size.m_data[2] = referenceImage.m_size.m_data[2];
      resultImage.m_pitch.m_data[0] = referenceImage._20_4_;
      resultImage.m_pitch.m_data._4_8_ = referenceImage.m_data.m_ptr;
      resultImage.m_format = referenceImage.m_format;
      resultImage.m_size.m_data[0] = referenceImage.m_size.m_data[0];
      resultImage.m_size.m_data[1] = referenceImage.m_size.m_data[1];
      referenceImage.m_format.order = R;
      referenceImage.m_format.type = SNORM_INT8;
      referenceImage.m_size.m_data[0] = 0;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage.m_size.m_data[2] = 0;
      referenceImage._20_4_ = 0;
      referenceImage.m_data.m_ptr = (void *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset(&local_3f8);
      local_3f8.m_data.deleter.m_device = (VkDevice)resultImage._16_8_;
      local_3f8.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)resultImage.m_pitch.m_data._4_8_;
      local_3f8.m_data.object.m_internal._0_4_ = resultImage.m_format.order;
      local_3f8.m_data.object.m_internal._4_4_ = resultImage.m_format.type;
      local_3f8.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImage.m_size.m_data._0_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&referenceImage);
      bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&features,pDVar12,
                 pVVar13,pAVar11,(VkBuffer)local_3f8.m_data.object.m_internal,(MemoryRequirement)0x1
                );
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      data_00.ptr._4_4_ = uVar25;
      data_00.ptr._0_4_ = fVar22;
      data_00._8_4_ = uVar26;
      data_00._12_4_ = uVar27;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3d8,
                 data_00);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&features);
      memcpy(*(PFN_vkFreeFunction *)(local_3d8._0_8_ + 0x18),
             vertexColors.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,VStack_450);
      ::vk::flushMappedMemoryRange
                (pDVar12,pVVar13,
                 (VkDeviceMemory)((VkDeviceMemory *)(local_3d8._0_8_ + 8))->m_internal,
                 (VkDeviceSize)*(PFN_vkReallocationFunction *)(local_3d8._0_8_ + 0x10),VStack_450);
      pPVar1 = context->m_progCollection;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&referenceImage,"vert",(allocator<char> *)&pipelineRasterizationStateInfo
                );
      pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&referenceImage);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar12,pVVar13,pPVar14,0);
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset(&local_3c8);
      local_3c8.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_3c8.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_3c8.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_3c8.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_3c8.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&resultImage);
      std::__cxx11::string::~string((string *)&referenceImage);
      pPVar1 = context->m_progCollection;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&referenceImage,"geom",(allocator<char> *)&pipelineRasterizationStateInfo
                );
      pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&referenceImage);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar12,pVVar13,pPVar14,0);
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset(&local_3a8);
      local_3a8.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_3a8.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_3a8.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_3a8.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_3a8.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&resultImage);
      std::__cxx11::string::~string((string *)&referenceImage);
      pPVar1 = context->m_progCollection;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&referenceImage,"frag",(allocator<char> *)&pipelineRasterizationStateInfo
                );
      pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&referenceImage);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImage,pDVar12,pVVar13,pPVar14,0);
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset(&local_388);
      local_388.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_388.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_388.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_388.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&resultImage);
      std::__cxx11::string::~string((string *)&referenceImage);
      referenceImage.m_format = (TextureFormat)((ulong)(uint)fStack_480 << 0x20);
      referenceImage.m_size.m_data[0] = 1;
      referenceImage.m_size.m_data[1] = 1;
      referenceImage.m_size.m_data[2] = 0;
      referenceImage._20_4_ = 2;
      referenceImage.m_data.m_ptr = (void *)0x1;
      referenceImage.m_data.m_cap = CONCAT44(referenceImage.m_data.m_cap._4_4_,2);
      features._32_8_ = &colorAttachmentRef;
      colorAttachmentRef.attachment = 0;
      colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      features.geometryShader = 0;
      features.tessellationShader = 0;
      features.dualSrcBlend = 0;
      features.drawIndirectFirstInstance = 0;
      features.depthClamp = 0;
      features.depthBiasClamp = 0;
      features.fillModeNonSolid = 0;
      features.depthBounds = 0;
      features.wideLines = 0;
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.largePoints = 0;
      features.alphaToOne = 0;
      resultImage.m_format.order = 0x26;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      features.sampleRateShading = 1;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 1;
      resultImage.m_data = (void *)CONCAT44(resultImage.m_data._4_4_,1);
      resultImage.m_pitch.m_data._4_8_ = &referenceImage;
      ::vk::createRenderPass
                ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo,pDVar12,
                 pVVar13,(VkRenderPassCreateInfo *)&resultImage,(VkAllocationCallbacks *)0x0);
      features.geometryShader = pipelineRasterizationStateInfo.flags;
      features.tessellationShader = pipelineRasterizationStateInfo.depthClampEnable;
      features.sampleRateShading = pipelineRasterizationStateInfo.rasterizerDiscardEnable;
      features.dualSrcBlend = pipelineRasterizationStateInfo.polygonMode;
      features.robustBufferAccess = pipelineRasterizationStateInfo.sType;
      features.fullDrawIndexUint32 = pipelineRasterizationStateInfo._4_4_;
      features._8_8_ = pipelineRasterizationStateInfo.pNext;
      pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      pipelineRasterizationStateInfo._4_4_ = 0;
      pipelineRasterizationStateInfo.pNext = (void *)0x0;
      pipelineRasterizationStateInfo.flags = 0;
      pipelineRasterizationStateInfo.depthClampEnable = 0;
      pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
      pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset(&local_368);
      local_368.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_368.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_368.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_368.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_368.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo);
      makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&resultImage,pDVar12,pVVar13,
                      (VkRenderPass)local_368.m_data.object.m_internal,1,(VkImageView *)&local_418,
                      local_488._0_4_,local_488._4_4_,1);
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset(&local_348);
      local_348.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_348.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_348.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_348.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_348.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&resultImage);
      makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultImage,pDVar12,pVVar13);
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset(&local_328);
      local_328.m_data.deleter.m_device._0_4_ = features.geometryShader;
      local_328.m_data.deleter.m_device._4_4_ = features.tessellationShader;
      local_328.m_data.deleter.m_allocator._0_4_ = features.sampleRateShading;
      local_328.m_data.deleter.m_allocator._4_4_ = features.dualSrcBlend;
      local_328.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_328.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&resultImage);
      HVar7.m_internal = local_388.m_data.object.m_internal;
      HVar5.m_internal = local_3a8.m_data.object.m_internal;
      HVar4.m_internal = local_3c8.m_data.object.m_internal;
      tcu::Vector<int,_2>::Vector(&local_580,(Vector<int,_2> *)local_488);
      fVar22 = local_458._0_4_;
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&local_540,
                 &scissors);
      vertexInputStateInfo.pVertexBindingDescriptions = &vertexInputBindingDescription;
      vertexInputBindingDescription.binding = 0;
      vertexInputBindingDescription.stride = 0x10;
      vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
      vertexInputStateInfo.pVertexAttributeDescriptions = vertexInputAttributeDescriptions;
      vertexInputAttributeDescriptions[0].location = 0;
      vertexInputAttributeDescriptions[0].binding = 0;
      vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
      vertexInputAttributeDescriptions[0].offset = 0;
      vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
      vertexInputStateInfo.pNext = (void *)0x0;
      vertexInputStateInfo.flags = 0;
      vertexInputStateInfo.vertexBindingDescriptionCount = 1;
      vertexInputStateInfo.vertexAttributeDescriptionCount = 1;
      res_1.x = 0.0;
      res_1.y = 0.0;
      res_1.width = (float)local_580.m_data[0];
      res_1.height = (float)local_580.m_data[1];
      res_1.minDepth = 0.0;
      res_1.maxDepth = 1.0;
      std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
                (&viewports,(long)(int)fVar22,&res_1,(allocator_type *)&features);
      rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::reserve
                (&rectScissors,(long)(int)fVar22);
      for (pVVar20 = local_540._M_impl.super__Vector_impl_data._M_start;
          HVar8.m_internal = local_388.m_data.object.m_internal,
          HVar6.m_internal = local_3a8.m_data.object.m_internal,
          pVVar20 != local_540._M_impl.super__Vector_impl_data._M_finish; pVVar20 = pVVar20 + 1) {
        features.robustBufferAccess = pVVar20->m_data[0];
        features.fullDrawIndexUint32 = pVVar20->m_data[1];
        features.imageCubeArray = pVVar20->m_data[2];
        features.independentBlend = pVVar20->m_data[3];
        std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::push_back
                  (&rectScissors,(value_type *)&features);
      }
      pipelineRasterizationStateInfo.pNext = (void *)0x0;
      pipelineRasterizationStateInfo.depthBiasClamp = 0.0;
      pipelineRasterizationStateInfo.depthBiasSlopeFactor = 0.0;
      pipelineRasterizationStateInfo.cullMode = 0;
      pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
      pipelineRasterizationStateInfo.depthBiasEnable = 0;
      pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
      pipelineRasterizationStateInfo.flags = 0;
      pipelineRasterizationStateInfo.depthClampEnable = 0;
      pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
      pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
      pipelineRasterizationStateInfo.sType =
           VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
      pipelineRasterizationStateInfo._4_4_ = 0;
      pipelineRasterizationStateInfo.lineWidth = 1.0;
      pipelineRasterizationStateInfo._60_4_ = 0;
      referenceImage.m_format.order = sBGR|ARGB;
      referenceImage.m_size.m_data[0] = 0;
      referenceImage.m_size.m_data[1] = 0;
      referenceImage.m_size.m_data[2] = 0;
      referenceImage._20_4_ = 0;
      referenceImage.m_data.m_ptr = &DAT_100000000;
      referenceImage.m_data.m_cap = 0;
      features.depthBiasClamp = 0x12;
      features.robustBufferAccess = 0x12;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0;
      features.tessellationShader = 1;
      features.sampleRateShading = (VkBool32)HVar4.m_internal;
      features.dualSrcBlend = (VkBool32)(HVar4.m_internal >> 0x20);
      features.logicOp = 0x9636a5;
      features.multiDrawIndirect = 0;
      features.drawIndirectFirstInstance = 0;
      features.depthClamp = 0;
      features.depthBounds = 0;
      features.wideLines = 0;
      features.largePoints = 0;
      features.alphaToOne = 8;
      colorAttachmentRef.attachment = 0x1a;
      local_3a8.m_data.object.m_internal._0_4_ = (undefined4)HVar5.m_internal;
      local_3a8.m_data.object.m_internal._4_4_ = SUB84(HVar5.m_internal,4);
      features.multiViewport = (undefined4)local_3a8.m_data.object.m_internal;
      features.samplerAnisotropy = local_3a8.m_data.object.m_internal._4_4_;
      features._80_8_ = (long)"pre_main" + 4;
      features.textureCompressionBC = 0;
      features.occlusionQueryPrecise = 0;
      features.fragmentStoresAndAtomics = 0;
      features.shaderTessellationAndGeometryPointSize = 0;
      features.shaderImageGatherExtended = 0;
      features.shaderStorageImageExtendedFormats = 0x10;
      local_388.m_data.object.m_internal._0_4_ = (undefined4)HVar7.m_internal;
      local_388.m_data.object.m_internal._4_4_ = SUB84(HVar7.m_internal,4);
      features.shaderStorageImageMultisample = (undefined4)local_388.m_data.object.m_internal;
      features.shaderStorageImageReadWithoutFormat = local_388.m_data.object.m_internal._4_4_;
      features._128_8_ = (long)"pre_main" + 4;
      features.shaderSampledImageArrayDynamicIndexing = 0;
      features.shaderStorageBufferArrayDynamicIndexing = 0;
      resultImage.m_format.order = sBGR|sR;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 3;
      resultImage.m_data = &vertexInputStateInfo;
      resultImage.m_pitch.m_data._4_8_ = &features;
      features.pipelineStatisticsQuery = features.depthBiasClamp;
      local_3a8.m_data.object.m_internal = HVar6.m_internal;
      local_388.m_data.object.m_internal = HVar8.m_internal;
      ::vk::createGraphicsPipeline
                ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_578,pDVar12,pVVar13,
                 (VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)&resultImage,
                 (VkAllocationCallbacks *)0x0);
      std::_Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~_Vector_base
                (&rectScissors.super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>);
      std::_Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~_Vector_base
                (&viewports.super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>);
      features._16_8_ = local_578.m_data.deleter.m_device;
      features.sampleRateShading = (VkBool32)local_578.m_data.deleter.m_allocator;
      features.dualSrcBlend = (VkBool32)((ulong)local_578.m_data.deleter.m_allocator >> 0x20);
      features.robustBufferAccess = (undefined4)local_578.m_data.object.m_internal;
      features.fullDrawIndexUint32 = local_578.m_data.object.m_internal._4_4_;
      features._8_8_ = local_578.m_data.deleter.m_deviceIface;
      local_578.m_data.object.m_internal = 0;
      local_578.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_578.m_data.deleter.m_device = (VkDevice)0x0;
      local_578.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset(&local_308);
      local_308.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_308.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_308.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_308.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_308.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_578);
      std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
                (&local_540);
      ::vk::createCommandPool
                ((Move<vk::Handle<(vk::HandleType)24>_> *)&resultImage,pDVar12,pVVar13,2,
                 queueFamilyIndex,(VkAllocationCallbacks *)0x0);
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset(&local_2e8);
      local_2e8.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_2e8.m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_2e8.m_data.object.m_internal._0_4_ = features.robustBufferAccess;
      local_2e8.m_data.object.m_internal._4_4_ = features.fullDrawIndexUint32;
      local_2e8.m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&resultImage);
      ::vk::allocateCommandBuffer
                ((Move<vk::VkCommandBuffer_s_*> *)&resultImage,pDVar12,pVVar13,
                 (VkCommandPool)local_2e8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
      features.geometryShader = resultImage.m_size.m_data[2];
      features.tessellationShader = resultImage.m_pitch.m_data[0];
      features.sampleRateShading = resultImage.m_pitch.m_data[1];
      features.dualSrcBlend = resultImage.m_pitch.m_data[2];
      features.robustBufferAccess = resultImage.m_format.order;
      features.fullDrawIndexUint32 = resultImage.m_format.type;
      features.imageCubeArray = resultImage.m_size.m_data[0];
      features.independentBlend = resultImage.m_size.m_data[1];
      resultImage.m_format.order = R;
      resultImage.m_format.type = SNORM_INT8;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = 0;
      resultImage.m_pitch.m_data[0] = 0;
      resultImage.m_pitch.m_data[1] = 0;
      resultImage.m_pitch.m_data[2] = 0;
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset(local_2c8);
      local_2c8[0].m_data.deleter.m_pool.m_internal =
           CONCAT44(features.dualSrcBlend,features.sampleRateShading);
      local_2c8[0].m_data.deleter.m_device = (VkDevice)features._16_8_;
      local_2c8[0].m_data.object = (VkCommandBuffer_s *)features._0_8_;
      local_2c8[0].m_data.deleter.m_deviceIface = (DeviceInterface *)features._8_8_;
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                ((RefBase<vk::VkCommandBuffer_s_*> *)&resultImage);
      HVar3.m_internal = local_508.m_data.object.m_internal;
      pDVar12 = Context::getDeviceInterface(context);
      pVVar13 = Context::getDevice(context);
      queue = Context::getUniversalQueue(context);
      beginCommandBuffer(pDVar12,local_2c8[0].m_data.object);
      referenceImage.m_format = local_468;
      referenceImage.m_size.m_data[0] = aiStack_460[0];
      referenceImage.m_size.m_data[1] = aiStack_460[1];
      resultImage.m_format.order = 0x2b;
      resultImage.m_size.m_data[0] = 0;
      resultImage.m_size.m_data[1] = 0;
      resultImage.m_size.m_data[2] = (undefined4)local_368.m_data.object.m_internal;
      resultImage.m_pitch.m_data[0] = local_368.m_data.object.m_internal._4_4_;
      resultImage.m_pitch.m_data[1] = (undefined4)local_348.m_data.object.m_internal;
      resultImage.m_pitch.m_data[2] = local_348.m_data.object.m_internal._4_4_;
      resultImage.m_data = (void *)0x0;
      (*pDVar12->_vptr_DeviceInterface[0x74])(pDVar12,local_2c8[0].m_data.object,&resultImage,0);
      (*pDVar12->_vptr_DeviceInterface[0x4c])
                (pDVar12,local_2c8[0].m_data.object,0,local_308.m_data.object.m_internal);
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      (*pDVar12->_vptr_DeviceInterface[0x58])
                (pDVar12,local_2c8[0].m_data.object,0,1,&local_3f8,&features);
      (*pDVar12->_vptr_DeviceInterface[0x59])
                (pDVar12,local_2c8[0].m_data.object,(ulong)local_458 & 0xffffffff,1);
      (*pDVar12->_vptr_DeviceInterface[0x76])(pDVar12,local_2c8[0].m_data.object);
      features.robustBufferAccess = 0x2d;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0x100;
      features.tessellationShader = 0x800;
      features.sampleRateShading = 2;
      features.dualSrcBlend = 6;
      features.logicOp = 0xffffffff;
      features.multiDrawIndirect = 0xffffffff;
      features.drawIndirectFirstInstance = (VkBool32)local_448.m_data.object.m_internal;
      features.depthClamp = (VkBool32)(local_448.m_data.object.m_internal >> 0x20);
      features.depthBiasClamp = (VkBool32)fStack_47c;
      features.fillModeNonSolid = local_478._M_allocated_capacity._0_4_;
      features.depthBounds = local_478._M_allocated_capacity._4_4_;
      features.wideLines = local_478._8_4_;
      features.largePoints = local_478._12_4_;
      (*pDVar12->_vptr_DeviceInterface[0x6d])
                (pDVar12,local_2c8[0].m_data.object,0x400,0x1000,0,0,0,0,0,1,&features);
      features.robustBufferAccess = 0;
      features.fullDrawIndexUint32 = 0;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 1;
      features.tessellationShader = 0;
      features.sampleRateShading = 0;
      features.dualSrcBlend = 1;
      features.logicOp = 0;
      features.multiDrawIndirect = 0;
      features.drawIndirectFirstInstance = 0;
      features.depthClamp = local_488._0_4_;
      features.depthBiasClamp = local_488._4_4_;
      features.fillModeNonSolid = 1;
      uVar25 = SUB84(&features,0);
      (*pDVar12->_vptr_DeviceInterface[99])
                (pDVar12,local_2c8[0].m_data.object,local_448.m_data.object.m_internal,6,
                 HVar3.m_internal,1,uVar25);
      features.robustBufferAccess = 0x2c;
      features.imageCubeArray = 0;
      features.independentBlend = 0;
      features.geometryShader = 0x1000;
      features.tessellationShader = 0x2000;
      features.sampleRateShading = 0xffffffff;
      features.dualSrcBlend = 0xffffffff;
      features.logicOp = (VkBool32)HVar3.m_internal;
      features.multiDrawIndirect = (VkBool32)(HVar3.m_internal >> 0x20);
      features.drawIndirectFirstInstance = 0;
      features.depthClamp = 0;
      features.depthBiasClamp = 0xffffffff;
      features.fillModeNonSolid = 0xffffffff;
      (*pDVar12->_vptr_DeviceInterface[0x6d])
                (pDVar12,local_2c8[0].m_data.object,0x1000,0x4000,0,0,0,1,uVar25,0,0);
      result = (*pDVar12->_vptr_DeviceInterface[0x4a])(pDVar12,local_2c8[0].m_data.object);
      ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
                        ,0x2ac);
      submitCommandsAndWait(pDVar12,pVVar13,queue,local_2c8[0].m_data.object);
      ScissorRenderer::~ScissorRenderer((ScissorRenderer *)local_488);
      ::vk::invalidateMappedMemoryRange
                (vk_00,device,
                 (VkDeviceMemory)
                 ((colorBufferAlloc.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,0,bufferSize);
      local_488 = (undefined1  [8])::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&resultImage,(TextureFormat *)local_488,renderSize.m_data[0],renderSize.m_data[1],1
                 ,(colorBufferAlloc.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                  ->m_hostPtr);
      pipelineRasterizationStateInfo._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
      tcu::TextureLevel::TextureLevel
                (&referenceImage,(TextureFormat *)&pipelineRasterizationStateInfo,
                 renderSize.m_data[0],renderSize.m_data[1],1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_488,&referenceImage);
      tcu::clear((PixelBufferAccess *)local_488,&local_4e8);
      lVar18 = 0;
      for (uVar16 = 0;
          uVar16 < (ulong)((long)scissors.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)scissors.
                                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar16 = uVar16 + 1) {
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&features,&referenceImage);
        tcu::getSubregion((PixelBufferAccess *)local_488,(PixelBufferAccess *)&features,
                          *(int *)((long)(scissors.
                                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                  lVar18),
                          *(int *)((long)(scissors.
                                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                  lVar18 + 4),
                          *(int *)((long)(scissors.
                                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                  lVar18 + 8),
                          *(int *)((long)(scissors.
                                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                  lVar18 + 0xc));
        tcu::clear((PixelBufferAccess *)local_488,
                   (Vec4 *)((long)(vertexColors.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18));
        lVar18 = lVar18 + 0x10;
      }
      log = context->m_testCtx->m_log;
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_488,&referenceImage);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&features,0.02);
      bVar21 = tcu::floatThresholdCompare
                         (log,"color","Image compare",(ConstPixelBufferAccess *)local_488,
                          &resultImage,(Vec4 *)&features,COMPARE_LOG_RESULT);
      if (bVar21) {
        tcu::TextureLevel::~TextureLevel(&referenceImage);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_488,"OK",(allocator<char> *)&features);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_488);
        std::__cxx11::string::~string((string *)local_488);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_488,"Rendered image is not correct",(allocator<char> *)&features)
        ;
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_488);
        std::__cxx11::string::~string((string *)local_488);
        tcu::TextureLevel::~TextureLevel(&referenceImage);
      }
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&colorBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_508);
      std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
                (&scissors.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&vertexColors.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return __return_storage_ptr__;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Implementation doesn\'t support minimum required number of viewports",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/fragment_ops/vktFragmentOperationsScissorMultiViewportTests.cpp"
               ,0x17f);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus test (Context& context, const int numViewports)
{
	requireFeatureMultiViewport(context.getInstanceInterface(), context.getPhysicalDevice());

	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	Allocator&						allocator			= context.getDefaultAllocator();

	const IVec2						renderSize			(128, 128);
	const VkFormat					colorFormat			= VK_FORMAT_R8G8B8A8_UNORM;
	const Vec4						clearColor			(0.5f, 0.5f, 0.5f, 1.0f);
	const std::vector<Vec4>			vertexColors		= generateColors(numViewports);
	const std::vector<IVec4>		scissors			= generateScissors(numViewports, renderSize);

	const VkDeviceSize				colorBufferSize		= renderSize.x() * renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *colorBufferAlloc, colorBufferSize);

	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Rendering a colorful grid of " << numViewports << " rectangle(s)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Not covered area will be filled with a gray color." << tcu::TestLog::EndMessage;
	}

	// Draw
	{
		const ScissorRenderer renderer (context, renderSize, numViewports, scissors, colorFormat, clearColor, vertexColors);
		renderer.draw(context, *colorBuffer);
	}

	// Log image
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), 0ull, colorBufferSize);

		const tcu::ConstPixelBufferAccess	resultImage		(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferAlloc->getHostPtr());
		const tcu::TextureLevel				referenceImage	= generateReferenceImage(mapVkFormat(colorFormat), renderSize, clearColor, scissors, vertexColors);

		// Images should now match.
		if (!tcu::floatThresholdCompare(context.getTestContext().getLog(), "color", "Image compare", referenceImage.getAccess(), resultImage, Vec4(0.02f), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is not correct");
	}

	return tcu::TestStatus::pass("OK");
}